

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall
imrt::EvaluationFunction::generate_linear_system
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  Station *this_00;
  _List_node_base *p_Var1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  Matrix *pMVar4;
  pointer piVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  int iVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  _List_node_base local_48;
  
  if (0 < this->nb_organs) {
    lVar9 = 0;
    bVar10 = false;
    do {
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]) {
        iVar8 = 0;
        do {
          if (bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," + ",3);
          }
          if (iVar8 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          }
          dVar13 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
          if ((dVar13 != 0.0) || (NAN(dVar13))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max(",4);
            poVar2 = std::ostream::_M_insert<double>
                               ((Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"- Z_",4);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max(Z_",6);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-",1);
            poVar2 = std::ostream::_M_insert<double>
                               ((Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", 0)^2",6);
          iVar11 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
          if (iVar8 == iVar11 + -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
            iVar11 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          }
          iVar8 = iVar8 + 1;
          bVar10 = true;
        } while (iVar8 < iVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/",1);
      std::ostream::operator<<
                ((ostream *)&std::cout,
                 (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->nb_organs);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  iVar8 = this->nb_organs;
  if (0 < iVar8) {
    piVar5 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      if (0 < piVar5[lVar9]) {
        lVar12 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Z_",2);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
          p_Var3 = (_List_node_base *)Plan::get_stations_abi_cxx11_(p);
          p_Var6 = p_Var3->_M_next;
          if (p_Var6 != p_Var3) {
            bVar10 = false;
            iVar8 = 0;
            do {
              this_00 = (Station *)p_Var6[1]._M_next;
              pMVar4 = Station::getDepositionMatrix(this_00,(int)lVar9);
              if (0 < this_00->max_apertures) {
                iVar11 = 0;
                do {
                  Station::open_beamlets_abi_cxx11_
                            ((list<int,_std::allocator<int>_> *)&local_48,this_00,iVar11);
                  if (local_48._M_next != &local_48) {
                    dVar13 = 0.0;
                    p_Var7 = local_48._M_next;
                    do {
                      dVar13 = dVar13 + pMVar4->p[lVar12][*(int *)&p_Var7[1]._M_next];
                      p_Var7 = (((_List_base<int,_std::allocator<int>_> *)&p_Var7->_M_next)->_M_impl
                               )._M_node.super__List_node_base._M_next;
                      p_Var1 = local_48._M_next;
                    } while (p_Var7 != &local_48);
                    while (p_Var1 != &local_48) {
                      p_Var7 = p_Var1->_M_next;
                      operator_delete(p_Var1);
                      p_Var1 = p_Var7;
                    }
                    if (0.0 < dVar13) {
                      if (bVar10) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout," + ",3);
                      }
                      poVar2 = std::ostream::_M_insert<double>(dVar13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2," * I_",5);
                      std::ostream::operator<<((ostream *)poVar2,iVar8);
                      bVar10 = true;
                    }
                  }
                  iVar8 = iVar8 + 1;
                  iVar11 = iVar11 + 1;
                } while (iVar11 < this_00->max_apertures);
              }
              p_Var6 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                        &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (p_Var6 != p_Var3);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          lVar12 = lVar12 + 1;
          piVar5 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (lVar12 < piVar5[lVar9]);
        iVar8 = this->nb_organs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar8);
  }
  return;
}

Assistant:

void EvaluationFunction::generate_linear_system(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	bool flag=false;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(flag) cout << " + ";
			flag = true;
			if(k==0) cout << "(";
			if(Zmin[o] == 0 )
				cout << "max(Z_" << o << "_" << k << "-" << Zmax[o] << ", 0)^2" ;
			else
				cout << "max(" << Zmin[o] << "- Z_" << o << "_" << k << ", 0)^2" ;
			if(k==nb_voxels[o]-1) cout << ")";
		}
		cout << "/" << nb_voxels[o];
	}
	cout << endl;

	for(int o=0; o<nb_organs; o++){
		for(int k=0; k<nb_voxels[o]; k++){
			cout << "Z_" << o << "_" << k << "=" ;
			int ap=0; //aperture variable id
			bool flag = false;
			for(auto s : p.get_stations()){
				const Matrix&  D = s->getDepositionMatrix(o);
				for(int a=0; a<s->getNbApertures(); a++){
					double ap_dose_per_intensity=0.0;
					for(auto b: s->open_beamlets(a)) ap_dose_per_intensity+=D(k,b);

					if (ap_dose_per_intensity>0.0){
						if(flag) cout << " + ";
						cout << ap_dose_per_intensity << " * I_" << ap;
						flag = true;

					}
					ap++;
				}
			}
			cout << endl;
		}
	}
}